

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O0

void testBaseErrors(string *tempdir)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char *in_RDI;
  char *unaff_retaddr;
  char *errmsg;
  char *in_stack_ffffffffffffffe8;
  uint uVar5;
  
  lVar2 = exr_get_default_error_message(0);
  if (lVar2 == 0) {
    core_test_fail(unaff_retaddr,in_RDI,0,in_stack_ffffffffffffffe8);
  }
  lVar2 = exr_get_default_error_message(1);
  if (lVar2 == 0) {
    core_test_fail(unaff_retaddr,in_RDI,0,in_stack_ffffffffffffffe8);
  }
  lVar2 = exr_get_default_error_message(0x21);
  if (lVar2 == 0) {
    core_test_fail(unaff_retaddr,in_RDI,0,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_default_error_message(0xffffffff);
  if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,"Unknown error code"), iVar1 != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"errmsg: ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    uVar5 = (uint)((ulong)pcVar3 >> 0x20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  lVar2 = exr_get_default_error_message(0x22);
  if (lVar2 == 0) {
    core_test_fail(unaff_retaddr,in_RDI,0,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_default_error_message(0x6e);
  if (pcVar3 != (char *)0x0) {
    iVar1 = strcmp(pcVar3,"Unknown error code");
    uVar5 = (uint)((ulong)pcVar3 >> 0x20);
    if (iVar1 == 0) goto LAB_0010afb5;
  }
  uVar5 = (uint)((ulong)pcVar3 >> 0x20);
  core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
LAB_0010afb5:
  pcVar3 = (char *)exr_get_error_code_as_string(0);
  iVar1 = strcmp(pcVar3,"EXR_ERR_SUCCESS");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x21);
  iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x22);
  iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xffffffff);
  iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xfffffffe);
  iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x80000000);
  iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xd);
  iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_REQ_ATTR");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(1);
  iVar1 = strcmp(pcVar3,"EXR_ERR_OUT_OF_MEMORY");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(2);
  iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_CONTEXT_ARG");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(3);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_ARGUMENT");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(4);
  iVar1 = strcmp(pcVar3,"EXR_ERR_ARGUMENT_OUT_OF_RANGE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(5);
  iVar1 = strcmp(pcVar3,"EXR_ERR_FILE_ACCESS");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(6);
  iVar1 = strcmp(pcVar3,"EXR_ERR_FILE_BAD_HEADER");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(7);
  iVar1 = strcmp(pcVar3,"EXR_ERR_NOT_OPEN_READ");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(8);
  iVar1 = strcmp(pcVar3,"EXR_ERR_NOT_OPEN_WRITE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(9);
  iVar1 = strcmp(pcVar3,"EXR_ERR_HEADER_NOT_WRITTEN");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(10);
  iVar1 = strcmp(pcVar3,"EXR_ERR_READ_IO");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xb);
  iVar1 = strcmp(pcVar3,"EXR_ERR_WRITE_IO");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xc);
  iVar1 = strcmp(pcVar3,"EXR_ERR_NAME_TOO_LONG");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xd);
  iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_REQ_ATTR");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xe);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_ATTR");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0xf);
  iVar1 = strcmp(pcVar3,"EXR_ERR_NO_ATTR_BY_NAME");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x16);
  iVar1 = strcmp(pcVar3,"EXR_ERR_BAD_CHUNK_LEADER");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x17);
  iVar1 = strcmp(pcVar3,"EXR_ERR_CORRUPT_CHUNK");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1f);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_SAMPLE_DATA");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x10);
  iVar1 = strcmp(pcVar3,"EXR_ERR_ATTR_TYPE_MISMATCH");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x11);
  iVar1 = strcmp(pcVar3,"EXR_ERR_ATTR_SIZE_MISMATCH");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x18);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INCOMPLETE_CHUNK_TABLE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x12);
  iVar1 = strcmp(pcVar3,"EXR_ERR_SCAN_TILE_MIXEDAPI");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x13);
  iVar1 = strcmp(pcVar3,"EXR_ERR_TILE_SCAN_MIXEDAPI");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x14);
  iVar1 = strcmp(pcVar3,"EXR_ERR_MODIFY_SIZE_CHANGE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x15);
  iVar1 = strcmp(pcVar3,"EXR_ERR_ALREADY_WROTE_ATTRS");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x19);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INCORRECT_PART");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1a);
  iVar1 = strcmp(pcVar3,"EXR_ERR_INCORRECT_CHUNK");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1b);
  iVar1 = strcmp(pcVar3,"EXR_ERR_USE_SCAN_DEEP_WRITE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1c);
  iVar1 = strcmp(pcVar3,"EXR_ERR_USE_TILE_DEEP_WRITE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1d);
  iVar1 = strcmp(pcVar3,"EXR_ERR_USE_SCAN_NONDEEP_WRITE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  pcVar3 = (char *)exr_get_error_code_as_string(0x1e);
  iVar1 = strcmp(pcVar3,"EXR_ERR_USE_TILE_NONDEEP_WRITE");
  if (iVar1 != 0) {
    core_test_fail(unaff_retaddr,in_RDI,uVar5,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void
testBaseErrors (const std::string& tempdir)
{
    const char* errmsg;

    // just spot check that we get results and don't get null for out
    // of bounds access
    errmsg = exr_get_default_error_message (EXR_ERR_SUCCESS);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (EXR_ERR_OUT_OF_MEMORY);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (EXR_ERR_UNKNOWN);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (-1);
    if (errmsg == NULL || strcmp (errmsg, "Unknown error code"))
    {
        std::cerr << "errmsg: " << errmsg << std::endl;
        EXRCORE_TEST (false);
    }
    errmsg = exr_get_default_error_message ((int) EXR_ERR_UNKNOWN + 1);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (110);
    if (errmsg == NULL || strcmp (errmsg, "Unknown error code"))
    {
        EXRCORE_TEST (false);
    }

    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_SUCCESS), "EXR_ERR_SUCCESS"));
    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_UNKNOWN), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string ((int) EXR_ERR_UNKNOWN + 1),
                 "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (exr_get_error_code_as_string (-1), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (exr_get_error_code_as_string (-2), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 ==
        strcmp (exr_get_error_code_as_string (INT32_MIN), "EXR_ERR_UNKNOWN"));

    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR),
                 "EXR_ERR_MISSING_REQ_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_OUT_OF_MEMORY),
                 "EXR_ERR_OUT_OF_MEMORY"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_CONTEXT_ARG),
                 "EXR_ERR_MISSING_CONTEXT_ARG"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_ARGUMENT),
                 "EXR_ERR_INVALID_ARGUMENT"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ARGUMENT_OUT_OF_RANGE),
                 "EXR_ERR_ARGUMENT_OUT_OF_RANGE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_FILE_ACCESS),
                 "EXR_ERR_FILE_ACCESS"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_FILE_BAD_HEADER),
                 "EXR_ERR_FILE_BAD_HEADER"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_READ),
                 "EXR_ERR_NOT_OPEN_READ"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_WRITE),
                 "EXR_ERR_NOT_OPEN_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_HEADER_NOT_WRITTEN),
                 "EXR_ERR_HEADER_NOT_WRITTEN"));
    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_READ_IO), "EXR_ERR_READ_IO"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_WRITE_IO),
                 "EXR_ERR_WRITE_IO"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NAME_TOO_LONG),
                 "EXR_ERR_NAME_TOO_LONG"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR),
                 "EXR_ERR_MISSING_REQ_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_ATTR),
                 "EXR_ERR_INVALID_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NO_ATTR_BY_NAME),
                 "EXR_ERR_NO_ATTR_BY_NAME"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_BAD_CHUNK_LEADER),
                 "EXR_ERR_BAD_CHUNK_LEADER"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_CORRUPT_CHUNK),
                 "EXR_ERR_CORRUPT_CHUNK"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_SAMPLE_DATA),
                 "EXR_ERR_INVALID_SAMPLE_DATA"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ATTR_TYPE_MISMATCH),
                 "EXR_ERR_ATTR_TYPE_MISMATCH"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ATTR_SIZE_MISMATCH),
                 "EXR_ERR_ATTR_SIZE_MISMATCH"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCOMPLETE_CHUNK_TABLE),
                 "EXR_ERR_INCOMPLETE_CHUNK_TABLE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_SCAN_TILE_MIXEDAPI),
                 "EXR_ERR_SCAN_TILE_MIXEDAPI"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_TILE_SCAN_MIXEDAPI),
                 "EXR_ERR_TILE_SCAN_MIXEDAPI"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MODIFY_SIZE_CHANGE),
                 "EXR_ERR_MODIFY_SIZE_CHANGE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ALREADY_WROTE_ATTRS),
                 "EXR_ERR_ALREADY_WROTE_ATTRS"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCORRECT_PART),
                 "EXR_ERR_INCORRECT_PART"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCORRECT_CHUNK),
                 "EXR_ERR_INCORRECT_CHUNK"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_SCAN_DEEP_WRITE),
                 "EXR_ERR_USE_SCAN_DEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_TILE_DEEP_WRITE),
                 "EXR_ERR_USE_TILE_DEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_SCAN_NONDEEP_WRITE),
                 "EXR_ERR_USE_SCAN_NONDEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_TILE_NONDEEP_WRITE),
                 "EXR_ERR_USE_TILE_NONDEEP_WRITE"));
}